

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void ts_stack_clear(Stack *self)

{
  uint uVar1;
  StackNode *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined2 local_24;
  undefined4 local_20;
  uint local_14;
  Stack *pSStack_10;
  uint32_t i;
  Stack *self_local;
  
  pSStack_10 = self;
  stack_node_retain(self->base_node);
  for (local_14 = 0; local_14 < (pSStack_10->heads).size; local_14 = local_14 + 1) {
    stack_head_delete((pSStack_10->heads).contents + local_14,&pSStack_10->node_pool,
                      pSStack_10->subtree_pool);
  }
  (pSStack_10->heads).size = 0;
  array__grow((VoidArray *)pSStack_10,0x28);
  uVar1 = (pSStack_10->heads).size;
  (pSStack_10->heads).size = uVar1 + 1;
  local_40 = pSStack_10->base_node;
  local_38 = 0;
  local_30 = 0;
  local_28 = 0;
  local_24 = 0;
  local_20 = 0;
  memcpy((pSStack_10->heads).contents + uVar1,&local_40,0x28);
  return;
}

Assistant:

void ts_stack_clear(Stack *self) {
  stack_node_retain(self->base_node);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  array_push(&self->heads, ((StackHead){
    .node = self->base_node,
    .last_external_token = NULL_SUBTREE,
    .status = StackStatusActive,
    .lookahead_when_paused = 0,
  }));
}